

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn_describe_cdn_domain_detail.cc
# Opt level: O2

int __thiscall
aliyun::Cdn::DescribeCdnDomainDetail
          (Cdn *this,CdnDescribeCdnDomainDetailRequestType *req,
          CdnDescribeCdnDomainDetailResponseType *response,CdnErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  Value *pVVar5;
  char *pcVar6;
  uint index;
  string local_400;
  allocator<char> local_3dc;
  allocator<char> local_3db;
  allocator<char> local_3da;
  allocator<char> local_3d9;
  Value val;
  value_type local_3c0;
  string str_response;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if (this->use_tls_ != false) {
    pcVar6 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar6,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_400);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&local_3c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar6,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&local_400);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"DescribeCdnDomainDetail",(allocator<char> *)&local_3c0);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"OwnerId",(allocator<char> *)&local_400);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"ResourceOwnerAccount",(allocator<char> *)&local_400);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"ResourceOwnerId",(allocator<char> *)&local_400);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->domain_name)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"DomainName",(allocator<char> *)&local_400);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->domain_name);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"RegionId",(allocator<char> *)&local_400);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,this->region_id_,(allocator<char> *)&local_3c0);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (CdnErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_400,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,anon_var_dwarf_df3b2 + 9,&local_3d9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_400);
        std::__cxx11::string::~string((string *)&local_400);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_400,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,anon_var_dwarf_df3b2 + 9,&local_3da);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_400);
        std::__cxx11::string::~string((string *)&local_400);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_400,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,anon_var_dwarf_df3b2 + 9,&local_3db);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_400);
        std::__cxx11::string::~string((string *)&local_400);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_400,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,anon_var_dwarf_df3b2 + 9,&local_3dc);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_400);
        std::__cxx11::string::~string((string *)&local_400);
      }
      if (response != (CdnDescribeCdnDomainDetailResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"GetDomainDetailModel");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"GetDomainDetailModel");
          bVar1 = Json::Value::isMember(pVVar4,"GmtCreated");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"GmtCreated");
            Json::Value::asString_abi_cxx11_(&local_400,pVVar5);
            std::__cxx11::string::operator=
                      ((string *)&(response->get_domain_detail_model).gmt_created,
                       (string *)&local_400);
            std::__cxx11::string::~string((string *)&local_400);
          }
          bVar1 = Json::Value::isMember(pVVar4,"GmtModified");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"GmtModified");
            Json::Value::asString_abi_cxx11_(&local_400,pVVar5);
            std::__cxx11::string::operator=
                      ((string *)&(response->get_domain_detail_model).gmt_modified,
                       (string *)&local_400);
            std::__cxx11::string::~string((string *)&local_400);
          }
          bVar1 = Json::Value::isMember(pVVar4,"SourceType");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"SourceType");
            Json::Value::asString_abi_cxx11_(&local_400,pVVar5);
            std::__cxx11::string::operator=
                      ((string *)&(response->get_domain_detail_model).source_type,
                       (string *)&local_400);
            std::__cxx11::string::~string((string *)&local_400);
          }
          bVar1 = Json::Value::isMember(pVVar4,"DomainStatus");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"DomainStatus");
            Json::Value::asString_abi_cxx11_(&local_400,pVVar5);
            std::__cxx11::string::operator=
                      ((string *)&(response->get_domain_detail_model).domain_status,
                       (string *)&local_400);
            std::__cxx11::string::~string((string *)&local_400);
          }
          bVar1 = Json::Value::isMember(pVVar4,"CdnType");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"CdnType");
            Json::Value::asString_abi_cxx11_(&local_400,pVVar5);
            std::__cxx11::string::operator=
                      ((string *)&(response->get_domain_detail_model).cdn_type,(string *)&local_400)
            ;
            std::__cxx11::string::~string((string *)&local_400);
          }
          bVar1 = Json::Value::isMember(pVVar4,"Cname");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"Cname");
            Json::Value::asString_abi_cxx11_(&local_400,pVVar5);
            std::__cxx11::string::operator=
                      ((string *)&(response->get_domain_detail_model).cname,(string *)&local_400);
            std::__cxx11::string::~string((string *)&local_400);
          }
          bVar1 = Json::Value::isMember(pVVar4,"HttpsCname");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"HttpsCname");
            Json::Value::asString_abi_cxx11_(&local_400,pVVar5);
            std::__cxx11::string::operator=
                      ((string *)&(response->get_domain_detail_model).https_cname,
                       (string *)&local_400);
            std::__cxx11::string::~string((string *)&local_400);
          }
          bVar1 = Json::Value::isMember(pVVar4,"DomainName");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"DomainName");
            Json::Value::asString_abi_cxx11_(&local_400,pVVar5);
            std::__cxx11::string::operator=
                      ((string *)&(response->get_domain_detail_model).domain_name,
                       (string *)&local_400);
            std::__cxx11::string::~string((string *)&local_400);
          }
          bVar1 = Json::Value::isMember(pVVar4,"Remark");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"Remark");
            Json::Value::asString_abi_cxx11_(&local_400,pVVar5);
            std::__cxx11::string::operator=
                      ((string *)&(response->get_domain_detail_model).remark,(string *)&local_400);
            std::__cxx11::string::~string((string *)&local_400);
          }
          bVar1 = Json::Value::isMember(pVVar4,"Sources");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](pVVar4,"Sources");
            bVar1 = Json::Value::isMember(pVVar5,"Source");
            if (bVar1) {
              pVVar4 = Json::Value::operator[](pVVar4,"Sources");
              pVVar4 = Json::Value::operator[](pVVar4,"Source");
              bVar1 = Json::Value::isArray(pVVar4);
              if (bVar1) {
                for (index = 0; AVar3 = Json::Value::size(pVVar4), index < AVar3; index = index + 1)
                {
                  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
                  local_3c0._M_string_length = 0;
                  local_3c0.field_2._M_local_buf[0] = '\0';
                  pVVar5 = Json::Value::operator[](pVVar4,index);
                  Json::Value::asString_abi_cxx11_(&local_400,pVVar5);
                  std::__cxx11::string::operator=((string *)&local_3c0,(string *)&local_400);
                  std::__cxx11::string::~string((string *)&local_400);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)response,&local_3c0);
                  std::__cxx11::string::~string((string *)&local_3c0);
                }
              }
            }
          }
        }
      }
      goto LAB_0012c93b;
    }
  }
  iVar2 = -1;
  if (error_info != (CdnErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0012c93b:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Cdn::DescribeCdnDomainDetail(const CdnDescribeCdnDomainDetailRequestType& req,
                      CdnDescribeCdnDomainDetailResponseType* response,
                       CdnErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeCdnDomainDetail");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.domain_name.empty()) {
    req_rpc->AddRequestQuery("DomainName", req.domain_name);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}